

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O2

void __thiscall
cnn::DeepLSTMBuilder::DeepLSTMBuilder
          (DeepLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  Parameters *pPVar1;
  Parameters *pPVar2;
  Parameters *pPVar3;
  Parameters *pPVar4;
  Parameters *pPVar5;
  Parameters *pPVar6;
  Parameters *pPVar7;
  Parameters *pPVar8;
  Parameters *pPVar9;
  Parameters *pPVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<cnn::Parameters_*> __l;
  allocator_type local_111;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *local_88;
  Parameters *local_80;
  Parameters *local_78;
  Parameters *local_70;
  Parameters *local_68;
  Parameters *local_60;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters *local_40;
  Parameters *local_38;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14 = ZEXT464(0) << 0x40;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__DeepLSTMBuilder_003cbd98;
  this->params = (vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  )auVar14._0_24_;
  this->param_vars =
       (vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
        )auVar14._24_24_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar14._48_8_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar14._56_8_;
  *(undefined1 (*) [64])
   &(this->h).
    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar14;
  auVar13 = ZEXT432(0) << 0x40;
  this->h0 = (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>)auVar13._0_24_;
  (this->c0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar13._24_8_;
  *(undefined1 (*) [32])
   &(this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar13;
  this->layers = layers;
  uVar11 = input_dim;
  while (bVar12 = layers != 0, layers = layers - 1, bVar12) {
    x._M_len = 2;
    x._M_array = (iterator)
                 &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar11;
    Dim::Dim((Dim *)&local_88,x);
    pPVar1 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_00._M_len = 2;
    x_00._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_00);
    pPVar2 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_01._M_len = 2;
    x_01._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_01);
    pPVar3 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_02._M_len = 1;
    x_02._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_02);
    pPVar4 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_03._M_len = 2;
    x_03._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar11;
    Dim::Dim((Dim *)&local_88,x_03);
    pPVar5 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_04._M_len = 2;
    x_04._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_04);
    pPVar6 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_05._M_len = 2;
    x_05._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_05);
    pPVar7 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_06._M_len = 1;
    x_06._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_06);
    pPVar8 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_07._M_len = 2;
    x_07._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar11;
    Dim::Dim((Dim *)&local_88,x_07);
    pPVar9 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_08._M_len = 2;
    x_08._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_08);
    pPVar10 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    x_09._M_len = 1;
    x_09._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_88,x_09);
    local_38 = Model::add_parameters(model,(Dim *)&local_88,0.0);
    __l._M_len = 0xb;
    __l._M_array = (iterator)&local_88;
    local_88 = pPVar1;
    local_80 = pPVar2;
    local_78 = pPVar3;
    local_70 = pPVar4;
    local_68 = pPVar5;
    local_60 = pPVar6;
    local_58 = pPVar7;
    local_50 = pPVar8;
    local_48 = pPVar9;
    local_40 = pPVar10;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
               &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,__l,
               &local_111);
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back(&this->params,
                (value_type *)
                &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
    std::_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~_Vector_base
              (&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
    uVar11 = hidden_dim + input_dim;
  }
  return;
}

Assistant:

DeepLSTMBuilder::DeepLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         Model* model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameters* p_x2i = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bi = model->add_parameters({hidden_dim});

    // o
    Parameters* p_x2o = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bo = model->add_parameters({hidden_dim});

    // c
    Parameters* p_x2c = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2c = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bc = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim + input_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}